

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling3d.cpp
# Opt level: O1

int __thiscall ncnn::Pooling3D::forward(Pooling3D *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  int *piVar10;
  int iVar11;
  int iVar12;
  void *pvVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  int iVar22;
  int iVar23;
  ulong uVar24;
  int iVar25;
  ulong uVar26;
  ulong uVar27;
  void *pvVar28;
  int iVar29;
  int iVar30;
  uint uVar31;
  ulong uVar32;
  uint uVar33;
  int iVar34;
  int l;
  uint uVar35;
  ulong uVar36;
  void *pvVar37;
  int iVar38;
  ulong uVar39;
  long lVar40;
  bool bVar41;
  float fVar42;
  int sz0;
  Mat bottom_blob_bordered;
  Mat m;
  vector<int,_std::allocator<int>_> _space_ofs;
  Option opt_pad;
  int local_264;
  ulong local_260;
  void *local_258;
  void *local_248;
  ulong local_228;
  ulong local_200;
  long local_1e0;
  long local_1d8;
  void *local_1d0;
  Mat local_198;
  ulong local_150;
  long local_148;
  Mat local_140;
  ulong local_f8;
  ulong local_f0;
  ulong local_e8;
  long local_e0;
  vector<int,_std::allocator<int>_> local_d8;
  Mat local_c0;
  Option local_78;
  
  iVar23 = bottom_blob->w;
  iVar2 = bottom_blob->h;
  iVar3 = bottom_blob->d;
  uVar4 = bottom_blob->c;
  uVar26 = (ulong)uVar4;
  sVar6 = bottom_blob->elemsize;
  if (this->global_pooling == 0) {
    if (this->adaptive_pooling == 0) {
      local_198.cstep = 0;
      local_198.data = (void *)0x0;
      local_198.refcount._0_4_ = 0;
      local_198.refcount._4_4_ = 0;
      local_198.elemsize._0_4_ = 0;
      local_198.elemsize._4_4_ = 0;
      local_198.elempack = 0;
      local_198.allocator = (Allocator *)0x0;
      local_198.dims = 0;
      local_198.w = 0;
      local_198.h = 0;
      local_198.d = 0;
      local_198.c = 0;
      local_78.lightmode = opt->lightmode;
      local_78._1_3_ = *(undefined3 *)&opt->field_0x1;
      local_78.num_threads = opt->num_threads;
      local_78.blob_allocator = opt->blob_allocator;
      local_78.workspace_allocator = opt->workspace_allocator;
      local_78.openmp_blocktime = opt->openmp_blocktime;
      local_78.use_winograd_convolution = opt->use_winograd_convolution;
      local_78.use_sgemm_convolution = opt->use_sgemm_convolution;
      local_78.use_int8_inference = opt->use_int8_inference;
      local_78.use_vulkan_compute = opt->use_vulkan_compute;
      uVar24._0_1_ = opt->use_bf16_storage;
      uVar24._1_1_ = opt->use_fp16_packed;
      uVar24._2_1_ = opt->use_fp16_storage;
      uVar24._3_1_ = opt->use_fp16_arithmetic;
      uVar24._4_1_ = opt->use_int8_packed;
      uVar24._5_1_ = opt->use_int8_storage;
      uVar24._6_1_ = opt->use_int8_arithmetic;
      uVar24._7_1_ = opt->use_packing_layout;
      local_78.use_shader_pack8 = opt->use_shader_pack8;
      local_78.use_subgroup_basic = opt->use_subgroup_basic;
      local_78.use_subgroup_vote = opt->use_subgroup_vote;
      local_78.use_subgroup_ballot = opt->use_subgroup_ballot;
      local_78.use_subgroup_shuffle = opt->use_subgroup_shuffle;
      local_78.use_image_storage = opt->use_image_storage;
      local_78.use_tensor_storage = opt->use_tensor_storage;
      local_78.use_weight_fp16_storage = opt->use_weight_fp16_storage;
      local_78.flush_denormals = opt->flush_denormals;
      local_78.use_local_pool_allocator = opt->use_local_pool_allocator;
      local_78.use_reserved_1 = opt->use_reserved_1;
      local_78.use_reserved_2 = opt->use_reserved_2;
      local_78.use_reserved_3 = opt->use_reserved_3;
      local_78.use_reserved_4 = opt->use_reserved_4;
      local_78.use_reserved_5 = opt->use_reserved_5;
      local_78.use_reserved_6 = opt->use_reserved_6;
      local_78.use_reserved_7 = opt->use_reserved_7;
      local_78.use_reserved_8 = opt->use_reserved_8;
      local_78.use_reserved_9 = opt->use_reserved_9;
      local_78.use_reserved_10 = opt->use_reserved_10;
      local_78.use_reserved_11 = opt->use_reserved_11;
      local_78._32_8_ = uVar24 & 0xffffffffffffff;
      make_padding(this,bottom_blob,&local_198,&local_78);
      iVar2 = local_198.h;
      iVar23 = local_198.w;
      iVar22 = -100;
      if ((local_198.data != (void *)0x0) && ((long)local_198.c * local_198.cstep != 0)) {
        iVar5 = local_198.d;
        iVar20 = (local_198.w - this->kernel_w) / this->stride_w;
        uVar24 = (long)(local_198.h - this->kernel_h) / (long)this->stride_h;
        local_150 = uVar24 & 0xffffffff;
        uVar33 = iVar20 + 1;
        uVar35 = (int)uVar24 + 1;
        uVar24 = (ulong)uVar35;
        iVar3 = (local_198.d - this->kernel_d) / this->stride_d;
        local_f0 = (ulong)(iVar3 + 1U);
        Mat::create(top_blob,uVar33,uVar35,iVar3 + 1U,uVar4,sVar6,(Allocator *)0x0);
        if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
          uVar27 = (long)this->kernel_d * (long)this->kernel_h * (long)this->kernel_w;
          std::vector<int,_std::allocator<int>_>::vector
                    (&local_d8,uVar27,(allocator_type *)&local_140);
          if (0 < this->kernel_d) {
            iVar22 = this->kernel_w;
            iVar11 = this->kernel_h;
            iVar18 = 0;
            iVar29 = 0;
            iVar25 = 0;
            do {
              if (0 < this->kernel_h) {
                iVar12 = 0;
                do {
                  if (0 < this->kernel_w) {
                    lVar16 = 0;
                    do {
                      local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar25 + lVar16] = iVar29 + (int)lVar16;
                      lVar16 = lVar16 + 1;
                      iVar30 = (int)lVar16;
                    } while (iVar30 < this->kernel_w);
                    iVar25 = iVar25 + iVar30;
                    iVar29 = iVar29 + iVar30;
                  }
                  iVar29 = iVar29 + (iVar23 - iVar22);
                  iVar12 = iVar12 + 1;
                } while (iVar12 < this->kernel_h);
              }
              iVar29 = iVar29 + (iVar2 - iVar11) * iVar23;
              iVar18 = iVar18 + 1;
            } while (iVar18 < this->kernel_d);
          }
          iVar22 = (int)uVar27;
          if (this->pooling_type == 1) {
            if (this->avgpool_count_include_pad == 0) {
              iVar22 = 0;
              local_264 = 0;
              iVar11 = 0;
              if (this->pad_mode == 0) {
                iVar22 = (bottom_blob->w - local_198.w) + this->pad_left + this->pad_right;
                local_264 = (bottom_blob->h - local_198.h) + this->pad_top + this->pad_bottom;
                iVar11 = (bottom_blob->d - local_198.d) + this->pad_front + this->pad_behind;
              }
              if (0 < (int)uVar4) {
                local_e0 = (long)(int)uVar33;
                uVar27 = 0;
                do {
                  if (local_198.dims == 3) {
                    lVar16 = local_198.cstep * uVar27 *
                             CONCAT44(local_198.elemsize._4_4_,(undefined4)local_198.elemsize);
                    local_140.dims = 2;
                    local_140.d = 1;
                    local_140.c = 1;
                  }
                  else {
                    lVar16 = local_198.cstep * uVar27 *
                             CONCAT44(local_198.elemsize._4_4_,(undefined4)local_198.elemsize);
                    local_140.dims = 3;
                    local_140.c = local_198.d;
                    local_140.d = 1;
                  }
                  local_140.elemsize =
                       CONCAT44(local_198.elemsize._4_4_,(undefined4)local_198.elemsize);
                  local_140.data = (void *)(lVar16 + (long)local_198.data);
                  local_140.h = local_198.h;
                  local_140.w = local_198.w;
                  local_140.allocator = local_198.allocator;
                  local_140.elempack = local_198.elempack;
                  local_140.refcount = (int *)0x0;
                  local_140.cstep = (long)local_198.h * (long)local_198.w;
                  local_f8 = uVar27;
                  Mat::channel(&local_c0,top_blob,(int)uVar27);
                  local_1d0 = local_c0.data;
                  Mat::~Mat(&local_c0);
                  if (-1 < iVar3) {
                    local_148 = (long)this->stride_d;
                    iVar18 = this->stride_h;
                    local_1e0 = 0;
                    uVar27 = 0;
                    do {
                      local_e8 = uVar27;
                      if (-1 < (int)local_150) {
                        iVar29 = this->stride_w;
                        uVar4 = this->kernel_d;
                        local_1d8 = 0;
                        local_200 = 0;
                        do {
                          if (-1 < iVar20) {
                            iVar25 = this->pad_front;
                            local_248 = (void *)0x0;
                            uVar27 = 0;
                            do {
                              fVar42 = NAN;
                              if (0 < (int)uVar4) {
                                lVar40 = (long)((local_264 + iVar2) - this->pad_bottom);
                                lVar16 = (long)((iVar11 + iVar5) - this->pad_behind);
                                lVar21 = (long)local_140.w * local_140.elemsize;
                                pvVar13 = (void *)((local_1e0 * local_140.h + local_1d8) * lVar21 +
                                                  (long)local_140.data);
                                fVar42 = 0.0;
                                uVar39 = 0;
                                iVar12 = 0;
                                do {
                                  lVar14 = local_e8 * local_148 + uVar39;
                                  iVar30 = 0x5e;
                                  if (iVar25 <= lVar14) {
                                    iVar30 = 0;
                                    if (lVar16 <= lVar14) {
                                      iVar30 = 0x5c;
                                    }
                                    if (lVar14 < lVar16 && 0 < this->kernel_h) {
                                      uVar17 = 0;
                                      pvVar37 = pvVar13;
                                      do {
                                        lVar14 = uVar17 + local_200 * (long)iVar18;
                                        iVar15 = 0x61;
                                        if (this->pad_top <= lVar14) {
                                          iVar15 = 0;
                                          if (lVar40 <= lVar14) {
                                            iVar15 = 0x5f;
                                          }
                                          pvVar28 = local_248;
                                          uVar36 = (ulong)(uint)this->kernel_w;
                                          if (lVar14 < lVar40 && 0 < this->kernel_w) {
                                            do {
                                              iVar30 = 100;
                                              if (((long)this->pad_left <= (long)pvVar28) &&
                                                 (iVar30 = 0x62,
                                                 (long)pvVar28 <
                                                 (long)((iVar22 + iVar23) - this->pad_right))) {
                                                fVar42 = fVar42 + *(float *)((long)pvVar37 +
                                                                            (long)pvVar28 * 4);
                                                iVar12 = iVar12 + 1;
                                                iVar30 = 0;
                                              }
                                              iVar15 = 0;
                                              if ((iVar30 != 100) && (iVar30 != 0)) break;
                                              uVar36 = uVar36 - 1;
                                              pvVar28 = (void *)((long)pvVar28 + 1);
                                            } while (uVar36 != 0);
                                          }
                                        }
                                        iVar30 = 0;
                                        if ((iVar15 != 0x61) && (iVar15 != 0)) break;
                                        uVar17 = uVar17 + 1;
                                        pvVar37 = (void *)((long)pvVar37 + lVar21);
                                      } while (uVar17 != (uint)this->kernel_h);
                                    }
                                  }
                                  if ((iVar30 != 0x5e) && (iVar30 != 0)) break;
                                  uVar39 = uVar39 + 1;
                                  pvVar13 = (void *)((long)pvVar13 + local_140.h * lVar21);
                                } while (uVar39 != uVar4);
                                fVar42 = fVar42 / (float)iVar12;
                              }
                              *(float *)((long)local_1d0 + uVar27 * 4) = fVar42;
                              uVar27 = uVar27 + 1;
                              local_248 = (void *)((long)local_248 + (long)iVar29);
                            } while (uVar27 != uVar33);
                          }
                          local_1d0 = (void *)((long)local_1d0 + local_e0 * 4);
                          local_200 = local_200 + 1;
                          local_1d8 = local_1d8 + iVar18;
                        } while (local_200 != uVar24);
                      }
                      local_1e0 = local_1e0 + local_148;
                      uVar27 = local_e8 + 1;
                    } while (local_e8 + 1 != local_f0);
                  }
                  Mat::~Mat(&local_140);
                  uVar27 = local_f8 + 1;
                } while (uVar27 != uVar26);
              }
            }
            else if (0 < (int)uVar4) {
              sVar6 = top_blob->cstep;
              sVar7 = top_blob->elemsize;
              pvVar13 = top_blob->data;
              lVar16 = (long)local_198.w *
                       CONCAT44(local_198.elemsize._4_4_,(undefined4)local_198.elemsize);
              local_260 = 0;
              do {
                if (-1 < iVar3) {
                  pvVar37 = (void *)(sVar6 * sVar7 * local_260 + (long)pvVar13);
                  iVar23 = 0;
                  do {
                    if (-1 < (int)local_150) {
                      iVar2 = this->stride_d;
                      iVar5 = this->stride_h;
                      iVar11 = this->stride_w;
                      uVar39 = 0;
                      do {
                        if (-1 < iVar20) {
                          uVar17 = 0;
                          do {
                            if (iVar22 < 1) {
                              fVar42 = 0.0;
                            }
                            else {
                              fVar42 = 0.0;
                              uVar36 = 0;
                              do {
                                fVar42 = fVar42 + *(float *)((long)local_198.data +
                                                            (long)local_d8.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar36] *
                                                  4 + uVar17 * (long)iVar11 * 4 +
                                                      uVar39 * iVar5 * lVar16 +
                                                      (long)iVar23 * (long)iVar2 *
                                                      local_198.h * lVar16 +
                                                      local_198.cstep *
                                                      CONCAT44(local_198.elemsize._4_4_,
                                                               (undefined4)local_198.elemsize) *
                                                      local_260);
                                uVar36 = uVar36 + 1;
                              } while ((uVar27 & 0xffffffff) != uVar36);
                            }
                            *(float *)((long)pvVar37 + uVar17 * 4) = fVar42 * (1.0 / (float)iVar22);
                            uVar17 = uVar17 + 1;
                          } while (uVar17 != uVar33);
                        }
                        pvVar37 = (void *)((long)pvVar37 + (long)(int)uVar33 * 4);
                        uVar39 = uVar39 + 1;
                      } while (uVar39 != uVar24);
                    }
                    bVar41 = iVar23 != iVar3;
                    iVar23 = iVar23 + 1;
                  } while (bVar41);
                }
                local_260 = local_260 + 1;
              } while (local_260 != uVar26);
            }
          }
          else if ((this->pooling_type == 0) && (0 < (int)uVar4)) {
            pvVar13 = top_blob->data;
            sVar6 = top_blob->cstep;
            sVar7 = top_blob->elemsize;
            lVar16 = (long)local_198.w *
                     CONCAT44(local_198.elemsize._4_4_,(undefined4)local_198.elemsize);
            local_260 = 0;
            do {
              if (-1 < iVar3) {
                pvVar37 = (void *)(sVar6 * sVar7 * local_260 + (long)pvVar13);
                iVar23 = 0;
                do {
                  if (-1 < (int)local_150) {
                    iVar2 = this->stride_d;
                    iVar5 = this->stride_h;
                    iVar11 = this->stride_w;
                    uVar39 = 0;
                    do {
                      if (-1 < iVar20) {
                        lVar40 = uVar39 * iVar5 * lVar16 +
                                 (long)iVar23 * (long)iVar2 * local_198.h * lVar16 +
                                 local_198.cstep *
                                 CONCAT44(local_198.elemsize._4_4_,(undefined4)local_198.elemsize) *
                                 local_260;
                        uVar17 = 0;
                        do {
                          lVar21 = uVar17 * (long)iVar11;
                          fVar42 = *(float *)((long)local_198.data + lVar21 * 4 + lVar40);
                          if (0 < iVar22) {
                            uVar36 = 0;
                            do {
                              fVar1 = *(float *)((long)local_198.data +
                                                (long)local_d8.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar36] *
                                                4 + lVar21 * 4 + lVar40);
                              if (fVar42 <= fVar1) {
                                fVar42 = fVar1;
                              }
                              uVar36 = uVar36 + 1;
                            } while ((uVar27 & 0xffffffff) != uVar36);
                          }
                          *(float *)((long)pvVar37 + uVar17 * 4) = fVar42;
                          uVar17 = uVar17 + 1;
                        } while (uVar17 != uVar33);
                      }
                      pvVar37 = (void *)((long)pvVar37 + (long)(int)uVar33 * 4);
                      uVar39 = uVar39 + 1;
                    } while (uVar39 != uVar24);
                  }
                  bVar41 = iVar23 != iVar3;
                  iVar23 = iVar23 + 1;
                } while (bVar41);
              }
              local_260 = local_260 + 1;
            } while (local_260 != uVar26);
          }
          if (local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start != (pointer)0x0) {
            operator_delete(local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          iVar22 = 0;
        }
      }
      piVar10 = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          if (local_198.allocator == (Allocator *)0x0) {
            if (local_198.data != (void *)0x0) {
              free(local_198.data);
            }
          }
          else {
            (*(local_198.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    else {
      Mat::create(top_blob,this->out_w,this->out_h,this->out_d,uVar4,sVar6,opt->blob_allocator);
      iVar22 = -100;
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        iVar22 = 0;
        if (this->pooling_type == 0) {
          if (0 < (int)uVar4) {
            pvVar13 = bottom_blob->data;
            sVar6 = bottom_blob->cstep;
            pvVar37 = top_blob->data;
            sVar7 = top_blob->cstep;
            iVar5 = this->out_h;
            iVar20 = this->out_d;
            sVar8 = bottom_blob->elemsize;
            sVar9 = top_blob->elemsize;
            local_228 = 0;
            do {
              if (0 < iVar20) {
                lVar16 = sVar6 * sVar8 * local_228;
                local_258 = (void *)(sVar7 * sVar9 * local_228 + (long)pvVar37);
                uVar4 = this->out_w;
                iVar22 = 0;
                do {
                  uVar24 = (long)(iVar22 * iVar3) / (long)iVar20;
                  iVar22 = iVar22 + 1;
                  uVar33 = (iVar22 * iVar3 + iVar20 + -1) / iVar20;
                  if (0 < iVar5) {
                    iVar11 = (int)uVar24;
                    iVar18 = 0;
                    do {
                      uVar27 = (long)(iVar18 * iVar2) / (long)iVar5;
                      iVar18 = iVar18 + 1;
                      uVar35 = (iVar18 * iVar2 + iVar5 + -1) / iVar5;
                      if (0 < (int)uVar4) {
                        iVar29 = (int)uVar27;
                        uVar39 = 0;
                        do {
                          uVar36 = uVar24 & 0xffffffff;
                          iVar25 = (iVar23 * (int)uVar39) / (int)uVar4;
                          uVar17 = uVar39 + 1;
                          iVar12 = (int)((int)uVar17 * iVar23 + (uVar4 - 1)) / (int)uVar4;
                          iVar30 = iVar25 + (iVar11 * iVar2 + iVar29) * iVar23;
                          fVar42 = *(float *)((long)pvVar13 + (long)iVar30 * 4 + lVar16);
                          if (iVar11 < (int)uVar33) {
                            do {
                              uVar32 = uVar27 & 0xffffffff;
                              iVar15 = iVar30;
                              if (iVar29 < (int)uVar35) {
                                do {
                                  lVar40 = (long)iVar12 - (long)iVar25;
                                  iVar34 = iVar15;
                                  if (iVar25 < iVar12) {
                                    do {
                                      fVar1 = *(float *)((long)pvVar13 + (long)iVar34 * 4 + lVar16);
                                      if (fVar42 <= fVar1) {
                                        fVar42 = fVar1;
                                      }
                                      iVar34 = iVar34 + 1;
                                      lVar40 = lVar40 + -1;
                                    } while (lVar40 != 0);
                                  }
                                  uVar31 = (int)uVar32 + 1;
                                  uVar32 = (ulong)uVar31;
                                  iVar15 = iVar15 + iVar23;
                                } while (uVar31 != uVar35);
                              }
                              uVar31 = (int)uVar36 + 1;
                              uVar36 = (ulong)uVar31;
                              iVar30 = iVar30 + iVar2 * iVar23;
                            } while (uVar31 != uVar33);
                          }
                          *(float *)((long)local_258 + uVar39 * 4) = fVar42;
                          uVar39 = uVar17;
                        } while (uVar17 != uVar4);
                      }
                      local_258 = (void *)((long)local_258 + (long)(int)uVar4 * 4);
                    } while (iVar18 != iVar5);
                  }
                } while (iVar22 != iVar20);
              }
              local_228 = local_228 + 1;
              iVar22 = 0;
            } while (local_228 != uVar26);
          }
        }
        else if ((this->pooling_type == 1) && (0 < (int)uVar4)) {
          pvVar13 = bottom_blob->data;
          sVar6 = bottom_blob->cstep;
          pvVar37 = top_blob->data;
          sVar7 = top_blob->cstep;
          iVar5 = this->out_h;
          iVar20 = this->out_d;
          sVar8 = bottom_blob->elemsize;
          sVar9 = top_blob->elemsize;
          local_228 = 0;
          do {
            if (0 < iVar20) {
              local_248 = (void *)(sVar7 * sVar9 * local_228 + (long)pvVar37);
              uVar4 = this->out_w;
              iVar22 = 0;
              do {
                iVar18 = (iVar22 * iVar3) / iVar20;
                iVar22 = iVar22 + 1;
                iVar11 = (iVar22 * iVar3 + iVar20 + -1) / iVar20;
                if (0 < iVar5) {
                  iVar29 = 0;
                  do {
                    uVar24 = (long)(iVar29 * iVar2) / (long)iVar5;
                    iVar29 = iVar29 + 1;
                    uVar33 = (iVar29 * iVar2 + iVar5 + -1) / iVar5;
                    if (0 < (int)uVar4) {
                      iVar25 = (int)uVar24;
                      uVar27 = 0;
                      do {
                        iVar30 = (iVar23 * (int)uVar27) / (int)uVar4;
                        uVar39 = uVar27 + 1;
                        iVar12 = (int)((int)uVar39 * iVar23 + (uVar4 - 1)) / (int)uVar4;
                        fVar42 = 0.0;
                        if (iVar18 < iVar11) {
                          iVar34 = (iVar2 * iVar18 + iVar25) * iVar23 + iVar30;
                          iVar15 = iVar18;
                          do {
                            uVar17 = uVar24 & 0xffffffff;
                            iVar38 = iVar34;
                            if (iVar25 < (int)uVar33) {
                              do {
                                lVar16 = (long)iVar12 - (long)iVar30;
                                iVar19 = iVar38;
                                if (iVar30 < iVar12) {
                                  do {
                                    fVar42 = fVar42 + *(float *)((long)pvVar13 +
                                                                (long)iVar19 * 4 +
                                                                sVar6 * sVar8 * local_228);
                                    iVar19 = iVar19 + 1;
                                    lVar16 = lVar16 + -1;
                                  } while (lVar16 != 0);
                                }
                                uVar35 = (int)uVar17 + 1;
                                uVar17 = (ulong)uVar35;
                                iVar38 = iVar38 + iVar23;
                              } while (uVar35 != uVar33);
                            }
                            iVar15 = iVar15 + 1;
                            iVar34 = iVar34 + iVar2 * iVar23;
                          } while (iVar15 != iVar11);
                        }
                        *(float *)((long)local_248 + uVar27 * 4) =
                             fVar42 / ((float)(iVar12 - iVar30) *
                                      (float)(int)(uVar33 - iVar25) * (float)(iVar11 - iVar18));
                        uVar27 = uVar39;
                      } while (uVar39 != uVar4);
                    }
                    local_248 = (void *)((long)local_248 + (long)(int)uVar4 * 4);
                  } while (iVar29 != iVar5);
                }
              } while (iVar22 != iVar20);
            }
            local_228 = local_228 + 1;
            iVar22 = 0;
          } while (local_228 != uVar26);
        }
      }
    }
  }
  else {
    Mat::create(top_blob,uVar4,sVar6,opt->blob_allocator);
    iVar22 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      uVar33 = iVar2 * iVar23 * iVar3;
      if (this->pooling_type == 0) {
        if ((int)uVar4 < 1) {
          return 0;
        }
        pvVar13 = bottom_blob->data;
        lVar16 = bottom_blob->cstep * bottom_blob->elemsize;
        pvVar37 = top_blob->data;
        uVar24 = 0;
        pvVar28 = pvVar13;
        do {
          fVar42 = *(float *)((long)pvVar13 + lVar16 * uVar24);
          if (0 < (int)uVar33) {
            uVar27 = 0;
            do {
              fVar1 = *(float *)((long)pvVar28 + uVar27 * 4);
              if (fVar42 <= fVar1) {
                fVar42 = fVar1;
              }
              uVar27 = uVar27 + 1;
            } while (uVar33 != uVar27);
          }
          *(float *)((long)pvVar37 + uVar24 * 4) = fVar42;
          uVar24 = uVar24 + 1;
          pvVar28 = (void *)((long)pvVar28 + lVar16);
        } while (uVar24 != uVar26);
      }
      else {
        if (this->pooling_type != 1) {
          return 0;
        }
        if ((int)uVar4 < 1) {
          return 0;
        }
        pvVar13 = bottom_blob->data;
        sVar6 = bottom_blob->cstep;
        pvVar37 = top_blob->data;
        sVar7 = bottom_blob->elemsize;
        uVar24 = 0;
        do {
          fVar42 = 0.0;
          if (0 < (int)uVar33) {
            uVar27 = 0;
            do {
              fVar42 = fVar42 + *(float *)((long)pvVar13 + uVar27 * 4);
              uVar27 = uVar27 + 1;
            } while (uVar33 != uVar27);
          }
          *(float *)((long)pvVar37 + uVar24 * 4) = fVar42 * (1.0 / (float)(int)uVar33);
          uVar24 = uVar24 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar6 * sVar7);
        } while (uVar24 != uVar26);
      }
      iVar22 = 0;
    }
  }
  return iVar22;
}

Assistant:

int Pooling3D::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // max value in NxN window
    // avg value in NxN window

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    //     NCNN_LOGE("Pooling     input %d x %d  pad = %d %d %d %d  ksize=%d %d  stride=%d %d", w, h, pad_left, pad_right, pad_top, pad_bottom, kernel_w, kernel_h, stride_w, stride_h);
    if (global_pooling)
    {
        top_blob.create(channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        int size = w * h * d;

        if (pooling_type == PoolMethod_MAX)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);

                float max_value = ptr[0];
                for (int i = 0; i < size; i++)
                {
                    max_value = std::max(max_value, ptr[i]);
                }

                top_blob[q] = max_value;
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);

                float sum = 0.f;
                for (int i = 0; i < size; i++)
                {
                    sum += ptr[i];
                }

                top_blob[q] = sum / size;
            }
        }

        return 0;
    }

    if (adaptive_pooling)
    {
        top_blob.create(out_w, out_h, out_d, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (pooling_type == PoolMethod_MAX)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* inptr = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);

                for (int z = 0; z < out_d; z++)
                {
                    // floor div
                    const int id0 = d * z / out_d;
                    // ceil div
                    const int id1 = (d * (z + 1) + out_d - 1) / out_d;
                    for (int i = 0; i < out_h; i++)
                    {
                        // floor div
                        const int ih0 = h * i / out_h;
                        // ceil div
                        const int ih1 = (h * (i + 1) + out_h - 1) / out_h;
                        for (int j = 0; j < out_w; j++)
                        {
                            // floor div
                            const int iw0 = w * j / out_w;
                            // ceil div
                            const int iw1 = (w * (j + 1) + out_w - 1) / out_w;

                            float max_value = inptr[id0 * w * h + ih0 * w + iw0];

                            for (int id = id0; id < id1; id++)
                            {
                                for (int ih = ih0; ih < ih1; ih++)
                                {
                                    for (int iw = iw0; iw < iw1; iw++)
                                    {
                                        max_value = std::max(max_value, inptr[id * w * h + ih * w + iw]);
                                    }
                                }
                            }

                            outptr[j] = max_value;
                        }

                        outptr += out_w;
                    }
                }
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* inptr = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);

                for (int z = 0; z < out_d; z++)
                {
                    // floor div
                    const int id0 = d * z / out_d;
                    // ceil div
                    const int id1 = (d * (z + 1) + out_d - 1) / out_d;
                    int dk = id1 - id0;
                    for (int i = 0; i < out_h; i++)
                    {
                        // floor div
                        const int ih0 = h * i / out_h;
                        // ceil div
                        const int ih1 = (h * (i + 1) + out_h - 1) / out_h;
                        int hk = ih1 - ih0;
                        for (int j = 0; j < out_w; j++)
                        {
                            // floor div
                            const int iw0 = w * j / out_w;
                            // ceil div
                            const int iw1 = (w * (j + 1) + out_w - 1) / out_w;
                            int wk = iw1 - iw0;

                            float sum = 0;
                            for (int id = id0; id < id1; id++)
                            {
                                for (int ih = ih0; ih < ih1; ih++)
                                {
                                    for (int iw = iw0; iw < iw1; iw++)
                                    {
                                        sum += inptr[id * w * h + ih * w + iw];
                                    }
                                }
                            }

                            outptr[j] = sum / hk / wk / dk;
                        }

                        outptr += out_w;
                    }
                }
            }
        }

        return 0;
    }

    Mat bottom_blob_bordered;
    Option opt_pad = opt;
    opt_pad.use_packing_layout = false;
    make_padding(bottom_blob, bottom_blob_bordered, opt_pad);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;
    d = bottom_blob_bordered.d;

    int outw = (w - kernel_w) / stride_w + 1;
    int outh = (h - kernel_h) / stride_h + 1;
    int outd = (d - kernel_d) / stride_d + 1;

    top_blob.create(outw, outh, outd, channels, elemsize);
    if (top_blob.empty())
        return -100;

    const int maxk = kernel_w * kernel_h * kernel_d;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap0 = w - kernel_w;
        int gap1 = h * w - w * kernel_h;
        for (int z = 0; z < kernel_d; z++)
        {
            for (int i = 0; i < kernel_h; i++)
            {
                for (int j = 0; j < kernel_w; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2 += 1;
                }
                p2 += gap0;
            }
            p2 += gap1;
        }
    }

    if (pooling_type == PoolMethod_MAX)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const Mat m = bottom_blob_bordered.channel(q);
            float* outptr = top_blob.channel(q);
            for (int z = 0; z < outd; z++)
            {
                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        const float* sptr = m.depth(z * stride_d).row(i * stride_h) + j * stride_w;

                        float max_value = sptr[0];

                        for (int l = 0; l < maxk; l++)
                        {
                            float val = sptr[space_ofs[l]];
                            max_value = std::max(max_value, val);
                        }

                        outptr[j] = max_value;
                    }

                    outptr += outw;
                }
            }
        }
    }
    else if (pooling_type == PoolMethod_AVE)
    {
        if (avgpool_count_include_pad == 0)
        {
            int wtailpad = 0;
            int htailpad = 0;
            int dtailpad = 0;

            if (pad_mode == 0) // full padding
            {
                wtailpad = bottom_blob_bordered.w - bottom_blob.w - pad_left - pad_right;
                htailpad = bottom_blob_bordered.h - bottom_blob.h - pad_top - pad_bottom;
                dtailpad = bottom_blob_bordered.d - bottom_blob.d - pad_front - pad_behind;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int z = 0; z < outd; z++)
                {
                    int sz0 = z * stride_d;

                    for (int i = 0; i < outh; i++)
                    {
                        int sy0 = i * stride_h;

                        for (int j = 0; j < outw; j++)
                        {
                            int sx0 = j * stride_w;

                            float sum = 0;
                            int area = 0;
                            for (int kd = 0; kd < kernel_d; kd++)
                            {
                                int sz = sz0 + kd;

                                if (sz < pad_front)
                                    continue;

                                if (sz >= d - pad_behind - dtailpad)
                                    break;

                                for (int ki = 0; ki < kernel_h; ki++)
                                {
                                    int sy = sy0 + ki;

                                    if (sy < pad_top)
                                        continue;

                                    if (sy >= h - pad_bottom - htailpad)
                                        break;

                                    for (int kj = 0; kj < kernel_w; kj++)
                                    {
                                        int sx = sx0 + kj;

                                        if (sx < pad_left)
                                            continue;

                                        if (sx >= w - pad_right - wtailpad)
                                            break;

                                        float val = m.depth(sz).row(sy)[sx];
                                        sum += val;
                                        area += 1;
                                    }
                                }
                            }

                            outptr[j] = sum / area;
                        }

                        outptr += outw;
                    }
                }
            }
        }
        else // if (avgpool_count_include_pad == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int z = 0; z < outd; z++)
                {
                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            const float* sptr = m.depth(z * stride_d).row(i * stride_h) + j * stride_w;

                            float sum = 0;

                            for (int l = 0; l < maxk; l++)
                            {
                                float val = sptr[space_ofs[l]];
                                sum += val;
                            }

                            outptr[j] = sum / maxk;
                        }

                        outptr += outw;
                    }
                }
            }
        }
    }

    return 0;
}